

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# djpeg.c
# Opt level: O2

boolean print_text_marker(j_decompress_ptr cinfo)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ushort **ppuVar4;
  long lVar5;
  bool bVar6;
  
  iVar1 = cinfo->err->trace_level;
  uVar2 = jpeg_getc(cinfo);
  uVar3 = jpeg_getc(cinfo);
  lVar5 = (ulong)(uVar3 | uVar2 << 8) - 2;
  if (0 < iVar1) {
    if (cinfo->unread_marker == 0xfe) {
      fprintf(_stderr,"Comment, length %ld:\n",lVar5);
    }
    else {
      fprintf(_stderr,"APP%d, length %ld:\n",(ulong)(cinfo->unread_marker - 0xe0),lVar5);
    }
  }
  uVar2 = 0;
  while (0 < lVar5) {
    lVar5 = lVar5 + -1;
    uVar3 = jpeg_getc(cinfo);
    if (0 < iVar1) {
      if ((char)uVar3 == '\n') {
        bVar6 = uVar2 != 0xd;
        uVar2 = 10;
        if (bVar6) {
          fputc(10,_stderr);
        }
      }
      else if ((uVar3 & 0xff) == 0xd) {
        fputc(10,_stderr);
        uVar2 = 0xd;
      }
      else if ((uVar3 & 0xff) == 0x5c) {
        fwrite("\\\\",2,1,_stderr);
        uVar2 = 0x5c;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        uVar2 = uVar3;
        if ((*(byte *)((long)*ppuVar4 + (ulong)uVar3 * 2 + 1) & 0x40) == 0) {
          fprintf(_stderr,"\\%03o",(ulong)uVar3);
        }
        else {
          putc(uVar3,_stderr);
        }
      }
    }
  }
  if (0 < iVar1) {
    fputc(10,_stderr);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
print_text_marker(j_decompress_ptr cinfo)
{
  boolean traceit = (cinfo->err->trace_level >= 1);
  long length;
  unsigned int ch;
  unsigned int lastch = 0;

  length = jpeg_getc(cinfo) << 8;
  length += jpeg_getc(cinfo);
  length -= 2;                  /* discount the length word itself */

  if (traceit) {
    if (cinfo->unread_marker == JPEG_COM)
      fprintf(stderr, "Comment, length %ld:\n", (long)length);
    else                        /* assume it is an APPn otherwise */
      fprintf(stderr, "APP%d, length %ld:\n",
              cinfo->unread_marker - JPEG_APP0, (long)length);
  }

  while (--length >= 0) {
    ch = jpeg_getc(cinfo);
    if (traceit) {
      /* Emit the character in a readable form.
       * Nonprintables are converted to \nnn form,
       * while \ is converted to \\.
       * Newlines in CR, CR/LF, or LF form will be printed as one newline.
       */
      if (ch == '\r') {
        fprintf(stderr, "\n");
      } else if (ch == '\n') {
        if (lastch != '\r')
          fprintf(stderr, "\n");
      } else if (ch == '\\') {
        fprintf(stderr, "\\\\");
      } else if (isprint(ch)) {
        putc(ch, stderr);
      } else {
        fprintf(stderr, "\\%03o", ch);
      }
      lastch = ch;
    }
  }

  if (traceit)
    fprintf(stderr, "\n");

  return TRUE;
}